

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator+=
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  uint *local_78;
  uint *itOut;
  size_type local_68;
  uint64_t newSize;
  unsigned_long buffer;
  uint *itSmallEnd;
  uint *itSmall;
  uint *itBig;
  uint *itSmallBeg;
  uint *itBigBeg;
  uint64_t sizeSmall;
  uint64_t sizeBig;
  BigInt<unsigned_int,_unsigned_long> *x_local;
  BigInt<unsigned_int,_unsigned_long> *this_local;
  
  sizeBig = (uint64_t)x;
  x_local = this;
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->_values);
  if (bVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_values,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
    this->_positive = (bool)(*(byte *)(sizeBig + 0x18) & 1);
  }
  else {
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
    if (!bVar2) {
      if ((this->_positive & 1U) == (*(byte *)(sizeBig + 0x18) & 1)) {
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_values);
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
        if (sVar3 < sVar4) {
          sizeSmall = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
          itBigBeg = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                       (&this->_values);
          itSmallBeg = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
          itBig = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->_values);
        }
        else {
          sizeSmall = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_values)
          ;
          itBigBeg = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        sizeBig);
          itSmallBeg = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                 (&this->_values);
          itBig = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
        }
        itSmall = itSmallBeg + sizeSmall;
        itSmallEnd = itBig + sizeSmall;
        buffer = (unsigned_long)(itBig + (long)itBigBeg + -1);
        do {
          itSmall = itSmall + -1;
          itSmallEnd = itSmallEnd + -1;
          bVar2 = false;
          if (itSmallEnd != (uint *)buffer) {
            bVar2 = *itSmall == 0xffffffff;
          }
        } while (bVar2);
        newSize = 0xffffffff;
        local_68 = sizeSmall;
        if (itSmallEnd == (uint *)buffer) {
          buffer = (unsigned_long)(itBig + -1);
          for (; itSmallEnd != (uint *)buffer && newSize == 0xffffffff; itSmallEnd = itSmallEnd + -1
              ) {
            newSize = (ulong)*itSmallEnd + (ulong)*itSmall;
            if (0xffffffff < newSize) {
              local_68 = sizeSmall + 1;
              break;
            }
            itSmall = itSmall + -1;
          }
        }
        itOut._4_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->_values,local_68,(value_type_conflict *)((long)&itOut + 4));
        itSmallEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig);
        itBigBeg = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)sizeBig
                                     );
        buffer = (unsigned_long)(itSmallEnd + (long)itBigBeg);
        local_78 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->_values);
        newSize = 0;
        for (; itSmallEnd != (uint *)buffer; itSmallEnd = itSmallEnd + 1) {
          uVar5 = (ulong)*itSmallEnd + (ulong)*local_78 + newSize;
          *local_78 = (uint)uVar5;
          newSize = uVar5 >> 0x20;
          local_78 = local_78 + 1;
        }
        for (; newSize != 0; newSize = uVar1 + newSize >> 0x20) {
          uVar1 = *local_78;
          *local_78 = (uint)(uVar1 + newSize);
          local_78 = local_78 + 1;
        }
      }
      else {
        this->_positive = (bool)((this->_positive ^ 0xffU) & 1);
        operator-=(this,(BigInt<unsigned_int,_unsigned_long> *)sizeBig);
        this->_positive = (bool)((this->_positive ^ 0xffU) & 1);
      }
    }
  }
  return this;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator+=(const BigInt<TBase, TBuffer>& x)
	{
		// If this == 0, return x

		if (_values.empty())
		{
			_values = x._values;
			_positive = x._positive;
			return *this;
		}

		// If x == 0, return this

		if (x._values.empty())
		{
			return *this;
		}

		// If this and x are not the same sign, perform a substraction

		if (_positive != x._positive)
		{
			_positive = !_positive;
			*this -= x;
			_positive = !_positive;
			return *this;
		}

		// Identifying the "biggest" number (the one with the most "digits")

		uint64_t sizeBig;
		uint64_t sizeSmall;
		const TBase* itBigBeg;
		const TBase* itSmallBeg;
		if (_values.size() >= x._values.size())
		{
			sizeBig = _values.size();
			sizeSmall = x._values.size();
			itBigBeg = _values.data();
			itSmallBeg = x._values.data();
		}
		else
		{
			sizeBig = x._values.size();
			sizeSmall = _values.size();
			itBigBeg = x._values.data();
			itSmallBeg = _values.data();
		}

		// Finding if an additional digit is necessary

		const TBase* itBig = itBigBeg + sizeBig - 1;
		const TBase* itSmall = itSmallBeg + sizeBig - 1;
		const TBase* itSmallEnd = itSmallBeg + sizeSmall - 1;
		while (itSmall != itSmallEnd && *itBig == _baseMax)
		{
			--itSmall;
			--itBig;
		}

		TBuffer buffer = _baseMax;
		uint64_t newSize = sizeBig;

		if (itSmall == itSmallEnd)
		{
			itSmallEnd = itSmallBeg - 1;
			while (itSmall != itSmallEnd && buffer == _baseMax)
			{
				buffer = static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itBig);
				if (buffer > _baseMax)
				{
					++newSize;
					break;
				}

				--itSmall;
				--itBig;
			}
		}

		// Compute the addition

		_values.resize(newSize, 0);
		itSmall = x._values.data();
		sizeSmall = x._values.size();

		itSmallEnd = itSmall + sizeSmall;

		TBase* itOut = _values.data();
		buffer = 0;
		while (itSmall != itSmallEnd)
		{
			buffer += static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itOut);
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itSmall;
			++itOut;
		}

		while (buffer != 0)
		{
			buffer += *itOut;
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itOut;
		}

		return *this;
	}